

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::hex_writer>>
          (basic_writer<fmt::v6::buffer_range<char>> *this,format_specs *specs,
          padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::hex_writer>
          *f)

{
  undefined8 *puVar1;
  long lVar2;
  byte bVar3;
  char *in_RAX;
  char *unaff_RBX;
  char *it;
  ulong uVar4;
  fill_t<char> *fill;
  ulong uVar5;
  size_t n;
  
  uVar5 = (ulong)specs->width;
  if ((long)uVar5 < 0) {
    assert_fail(unaff_RBX,0,in_RAX);
  }
  uVar4 = f->size_;
  n = uVar5 - uVar4;
  if (uVar5 < uVar4 || n == 0) {
    puVar1 = *(undefined8 **)this;
    uVar4 = uVar4 + puVar1[2];
    if ((ulong)puVar1[3] < uVar4) {
      (**(code **)*puVar1)(puVar1,uVar4);
    }
    puVar1[2] = uVar4;
    padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::hex_writer>
    ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::hex_writer>
                  *)f,(char **)&stack0xffffffffffffffc8);
  }
  else {
    puVar1 = *(undefined8 **)this;
    lVar2 = puVar1[2];
    uVar5 = (specs->fill).size_ * n + uVar4 + lVar2;
    if ((ulong)puVar1[3] < uVar5) {
      (**(code **)*puVar1)(puVar1,uVar5);
    }
    puVar1[2] = uVar5;
    it = (char *)(lVar2 + puVar1[1]);
    fill = &specs->fill;
    bVar3 = specs->field_0x9 & 0xf;
    if (bVar3 == 3) {
      it = fill<char*,char>(it,n >> 1,fill);
      padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::hex_writer>
      ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::hex_writer>
                    *)f,(char **)&stack0xffffffffffffffc8);
      n = n - (n >> 1);
    }
    else {
      if (bVar3 == 2) {
        fill<char*,char>(it,n,fill);
        padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::hex_writer>
        ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::hex_writer>
                      *)f,(char **)&stack0xffffffffffffffc8);
        return;
      }
      padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::hex_writer>
      ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::hex_writer>
                    *)f,(char **)&stack0xffffffffffffffc8);
    }
    fill<char*,char>(it,n,fill);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }